

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  ArrayIndex AVar1;
  ArrayIndex AVar2;
  Value *pVVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  AVar1 = Value::size(value);
  bVar8 = this->rightMargin_ <= (int)(AVar1 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (0 < (int)AVar1 && !bVar8) {
    iVar4 = 1;
    do {
      pVVar3 = Value::operator[](value,iVar4 + -1);
      bVar7 = bVar8 == false;
      bVar8 = true;
      if (bVar7) {
        if ((*(ushort *)&pVVar3->field_0x8 & 0xfe) == 6) {
          AVar2 = Value::size(pVVar3);
          bVar8 = AVar2 != 0;
        }
        else {
          bVar8 = false;
        }
      }
    } while ((iVar4 < (int)AVar1) && (iVar4 = iVar4 + 1, bVar8 == false));
  }
  if (bVar8 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar1);
    this->addChildValues_ = true;
    iVar4 = AVar1 * 2 + 2;
    if (0 < (int)AVar1) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        pVVar3 = Value::operator[](value,(int)uVar6);
        writeValue(this,pVVar3);
        iVar4 = iVar4 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar5);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (AVar1 != uVar6);
    }
    this->addChildValues_ = false;
    bVar8 = this->rightMargin_ <= iVar4;
  }
  return bVar8;
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}